

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O1

cJSON * get_item_from_pointer(cJSON *object,char *pointer,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  cJSON_bool cVar5;
  __int32_t **pp_Var6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  long in_FS_OFFSET;
  bool bVar10;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  if (pointer == (char *)0x0) {
LAB_00101623:
    object = (cJSON *)0x0;
  }
  else if (object != (cJSON *)0x0 && *pointer == '/') {
    do {
      pointer = (char *)((byte *)pointer + 1);
      iVar4 = cJSON_IsArray(object);
      if (iVar4 == 0) {
        iVar4 = cJSON_IsObject(object);
        if (iVar4 == 0) goto LAB_00101623;
        object = object->child;
        if (object == (cJSON *)0x0) {
          object = (cJSON *)0x0;
        }
        else {
          do {
            pbVar8 = (byte *)object->string;
            if (pbVar8 != (byte *)0x0) {
              bVar2 = *pbVar8;
              pbVar9 = (byte *)pointer;
              while (bVar2 != 0) {
                pbVar8 = pbVar8 + 1;
                bVar3 = *pbVar9;
                if (bVar3 == 0x7e) {
                  pbVar1 = pbVar9 + 1;
                  pbVar9 = pbVar9 + 1;
                  if (((bVar2 != 0x7e) || (*pbVar1 != 0x30)) &&
                     ((bVar2 != 0x2f || (*pbVar1 != 0x31)))) goto LAB_001015e6;
                }
                else {
                  bVar10 = false;
                  if ((bVar3 == 0) || (bVar3 == 0x2f)) goto LAB_001015cf;
                  if (case_sensitive == 0) {
                    pp_Var6 = __ctype_tolower_loc();
                    if ((*pp_Var6)[bVar2] != (*pp_Var6)[bVar3]) goto LAB_001015e6;
                  }
                  else if (bVar2 != bVar3) goto LAB_001015e6;
                }
                pbVar9 = pbVar9 + 1;
                bVar2 = *pbVar8;
              }
              bVar10 = true;
LAB_001015cf:
              if (bVar10 == (*pbVar9 == 0x2f || *pbVar9 == 0)) goto LAB_00101600;
            }
LAB_001015e6:
            object = object->next;
          } while (object != (cJSON *)0x0);
          object = (cJSON *)0x0;
        }
      }
      else {
        local_40 = 0;
        cVar5 = decode_array_index_from_pointer((uchar *)pointer,&local_40);
        if (cVar5 != 0) {
          object = (cJSON *)&object->child;
          sVar7 = local_40;
          do {
            object = object->next;
            bVar10 = sVar7 != 0;
            sVar7 = sVar7 - 1;
            if (object == (cJSON *)0x0) break;
          } while (bVar10);
        }
        if (cVar5 == 0) goto LAB_00101623;
      }
LAB_00101600:
      for (; (*pointer != 0 && (*pointer != 0x2f)); pointer = (char *)((byte *)pointer + 1)) {
      }
    } while ((*pointer == 0x2f) && (object != (cJSON *)0x0));
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == index) {
    return object;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON *get_item_from_pointer(cJSON * const object, const char * pointer, const cJSON_bool case_sensitive)
{
    cJSON *current_element = object;

    if (pointer == NULL)
    {
        return NULL;
    }

    /* follow path of the pointer */
    while ((pointer[0] == '/') && (current_element != NULL))
    {
        pointer++;
        if (cJSON_IsArray(current_element))
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer((const unsigned char*)pointer, &index))
            {
                return NULL;
            }

            current_element = get_array_item(current_element, index);
        }
        else if (cJSON_IsObject(current_element))
        {
            current_element = current_element->child;
            /* GetObjectItem. */
            while ((current_element != NULL) && !compare_pointers((unsigned char*)current_element->string, (const unsigned char*)pointer, case_sensitive))
            {
                current_element = current_element->next;
            }
        }
        else
        {
            return NULL;
        }

        /* skip to the next path token or end of string */
        while ((pointer[0] != '\0') && (pointer[0] != '/'))
        {
            pointer++;
        }
    }

    return current_element;
}